

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

void http_sconn_error(http_sconn *sc,nng_http_status err)

{
  nng_err nVar1;
  
  nng_http_set_status(sc->conn,err,(char *)0x0);
  nVar1 = nni_http_server_error(sc->server,sc->conn);
  if (nVar1 != NNG_OK) {
    http_sconn_close(sc);
    return;
  }
  if (sc->close == true) {
    nni_http_set_static_header(sc->conn,&sc->close_header,"Connection","close");
  }
  nni_http_write_res(sc->conn,&sc->txaio);
  return;
}

Assistant:

static void
http_sconn_error(http_sconn *sc, nng_http_status err)
{
	nng_http_set_status(sc->conn, err, NULL);
	if (nni_http_server_error(sc->server, sc->conn) != 0) {
		http_sconn_close(sc);
		return;
	}

	if (sc->close) {
		nni_http_set_static_header(
		    sc->conn, &sc->close_header, "Connection", "close");
	}
	nni_http_write_res(sc->conn, &sc->txaio);
}